

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall Js::ByteCodeWriter::EnsureLongBranch(ByteCodeWriter *this,OpCode op)

{
  uint uVar1;
  uint firstUnknownJumpOffset;
  int iVar2;
  List<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar3;
  Type pJVar4;
  code *pcVar5;
  bool bVar6;
  bool bVar7;
  int32 iVar8;
  ByteCodeLabel labelID;
  undefined4 *puVar9;
  Type *pTVar10;
  int iVar11;
  uint firstUnknownJumpOffset_00;
  long lVar12;
  bool bVar13;
  int local_44;
  
  if (this->useBranchIsland == false) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar9 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0xb08,"(useBranchIsland)","useBranchIsland");
    if (!bVar6) {
LAB_007d11c6:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar9 = 0;
  }
  firstUnknownJumpOffset_00 = (this->m_byteCodeData).currentOffset;
  if (((int)firstUnknownJumpOffset_00 < this->nextBranchIslandOffset) ||
     (this->inEnsureLongBranch == true)) {
    this->lastOpcode = op;
  }
  else {
    bVar6 = OpCodeAttr::HasFallThrough(this->lastOpcode);
    bVar13 = this->lastOpcode != Leave;
    this->lastOpcode = op;
    if ((((bVar13 && !bVar6) || (bVar7 = OpCodeAttr::HasFallThrough(op), bVar7)) ||
        (op == StatementBoundary)) || (op == Label)) {
      pLVar3 = this->m_jumpOffsets;
      uVar1 = this->firstUnknownJumpInfo;
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      local_44 = -1;
      for (lVar12 = (long)(int)uVar1;
          lVar12 < (pLVar3->
                   super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                   ).count; lVar12 = lVar12 + 1) {
        pJVar4 = (pLVar3->
                 super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                 ).buffer;
        firstUnknownJumpOffset = pJVar4[lVar12].patchOffset;
        if ((ulong)(this->m_byteCodeData).currentOffset - 2 < (ulong)firstUnknownJumpOffset) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          *puVar9 = 1;
          bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0xb28,
                                      "(jumpByteOffset <= this->m_byteCodeData.GetCurrentOffset() - sizeof(JumpOffset))"
                                      ,"Must have valid jump site within byte-code to back-patch");
          if (!bVar7) goto LAB_007d11c6;
          *puVar9 = 0;
        }
        iVar11 = pJVar4[lVar12].labelId;
        CheckLabel(this,iVar11);
        pTVar10 = JsUtil::
                  List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                  ::Item(this->m_labelOffsets,iVar11);
        if (*pTVar10 == 0xffffffff) {
          UpdateNextBranchIslandOffset(this,(uint)lVar12,firstUnknownJumpOffset);
          iVar2 = this->nextBranchIslandOffset;
          iVar8 = GetBranchLimit();
          if ((int)firstUnknownJumpOffset_00 < iVar8 / -2 + iVar2) goto LAB_007d1104;
          if (iVar11 == local_44) {
            if ((uint)lVar12 -
                (this->m_jumpOffsets->
                super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                ).count != -1) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar9 = 1;
              bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0xb48,"(index == m_jumpOffsets->Count() - 1)",
                                          "index == m_jumpOffsets->Count() - 1");
              if (!bVar6) goto LAB_007d11c6;
              *puVar9 = 0;
            }
            if ((int)firstUnknownJumpOffset_00 < this->nextBranchIslandOffset) goto LAB_007d1104;
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0xb49,"(currentOffset < this->nextBranchIslandOffset)",
                                        "currentOffset < this->nextBranchIslandOffset");
            if (!bVar6) goto LAB_007d11c6;
            *puVar9 = 0;
            goto LAB_007d1104;
          }
          this->inEnsureLongBranch = true;
          labelID = DefineLabel(this);
          pJVar4[lVar12].labelId = labelID;
          if (local_44 == -1 && (!bVar13 || bVar6)) {
            local_44 = DefineLabel(this);
            Br(this,Br,local_44);
            if ((this->m_byteCodeData).currentOffset - firstUnknownJumpOffset_00 != 3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar9 = 1;
              bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                          ,0xb5d,
                                          "(this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize)"
                                          ,
                                          "this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize"
                                         );
              if (!bVar7) goto LAB_007d11c6;
              *puVar9 = 0;
            }
            firstUnknownJumpOffset_00 = firstUnknownJumpOffset_00 + 3;
          }
          MarkLabel(this,labelID);
          BrLong(this,BrLong,iVar11);
          this->inEnsureLongBranch = false;
          if ((this->m_byteCodeData).currentOffset - firstUnknownJumpOffset_00 != 7) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0xb6a,
                                        "(this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize)"
                                        ,
                                        "this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize"
                                       );
            if (!bVar7) goto LAB_007d11c6;
            *puVar9 = 0;
          }
          firstUnknownJumpOffset_00 = firstUnknownJumpOffset_00 + 7;
        }
        else {
          iVar11 = *pTVar10 - firstUnknownJumpOffset;
          iVar8 = GetBranchLimit();
          if ((iVar8 <= iVar11) ||
             (iVar8 = GetBranchLimit(), SBORROW4(iVar11,-iVar8) != iVar11 + iVar8 < 0)) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar9 = 1;
            bVar7 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                        ,0xb34,
                                        "((int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit() && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit())"
                                        ,
                                        "(int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit() && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit()"
                                       );
            if (!bVar7) goto LAB_007d11c6;
            *puVar9 = 0;
          }
        }
      }
      UpdateNextBranchIslandOffset
                (this,(this->m_jumpOffsets->
                      super_ReadOnlyList<Js::ByteCodeWriter::JumpInfo,_Memory::ArenaAllocator,_DefaultComparer>
                      ).count,firstUnknownJumpOffset_00);
LAB_007d1104:
      if (local_44 != -1) {
        MarkLabel(this,local_44);
        return;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::EnsureLongBranch(Js::OpCode op)
    {
        Assert(useBranchIsland);
        int currentOffset = this->m_byteCodeData.GetCurrentOffset();

        // See if we need to emit branch island yet, and avoid recursion.
        if (currentOffset < this->nextBranchIslandOffset || this->inEnsureLongBranch)
        {
            lastOpcode = op;
            return;
        }

        // Leave actually may continue right after, it is only no fall through in the JIT.
        bool needBranchAround = OpCodeAttr::HasFallThrough(lastOpcode) || lastOpcode == Js::OpCode::Leave;
        lastOpcode = op;

        // If we are about to emit a no fall through op and the last was has fall through
        // then just emit the no fall through op, and then we can skip the branch around.
        // Except at label or StatementBoundary, we always want to emit before them.
        if ((needBranchAround && !OpCodeAttr::HasFallThrough(op))
            && op != Js::OpCode::StatementBoundary && op != Js::OpCode::Label)
        {
            return;
        }

        ByteCodeLabel branchAroundLabel = (Js::ByteCodeLabel)-1;
        bool foundUnknown = m_jumpOffsets->MapUntilFrom(firstUnknownJumpInfo,
            [=, &branchAroundLabel, &currentOffset](int index, JumpInfo& jumpInfo)
        {
            //
            // Read "labelID" stored at the offset within the byte-code.
            //
            uint jumpByteOffset = jumpInfo.patchOffset;
            AssertMsg(jumpByteOffset <= this->m_byteCodeData.GetCurrentOffset() - sizeof(JumpOffset),
                "Must have valid jump site within byte-code to back-patch");

            ByteCodeLabel labelID = jumpInfo.labelId;
            CheckLabel(labelID);

            // See if the label has bee marked yet.
            uint const labelByteOffset = m_labelOffsets->Item(labelID);
            if (labelByteOffset != UINT_MAX)
            {
                // If a label is already defined, then it should be short
                // (otherwise we should have emitted a branch island for it already).
                Assert((int)labelByteOffset - (int)jumpByteOffset < GetBranchLimit()
                    && (int)labelByteOffset - (int)jumpByteOffset >= -GetBranchLimit());
                return false;
            }

            this->UpdateNextBranchIslandOffset(index, jumpByteOffset);
            // Flush all the jump that are half of the way to the limit as well so we don't have
            // as many jump around of branch island.
            int flushNextBranchIslandOffset = this->nextBranchIslandOffset - GetBranchLimit() / 2;
            if (currentOffset < flushNextBranchIslandOffset)
            {
                // No need to for long branch yet. Terminate the loop.
                return true;
            }

            if (labelID == branchAroundLabel)
            {
                // Let's not flush the branchAroundLabel.
                // Should happen very rarely and mostly when the branch limit is very small.

                // This should be the last short jump we have just emitted (below).
                Assert(index == m_jumpOffsets->Count() - 1);
                Assert(currentOffset < this->nextBranchIslandOffset);
                return true;
            }

            // Emit long branch

            // Prevent recursion when we emit byte code here
            this->inEnsureLongBranch = true;

            // Create the branch label and update the jumpInfo.
            // Need to update the jumpInfo before we add the branch island as that might resize the m_jumpOffsets list.
            ByteCodeLabel longBranchLabel = this->DefineLabel();
            jumpInfo.labelId = longBranchLabel;

            // Emit the branch around if it hasn't been emitted already
            if (branchAroundLabel == (Js::ByteCodeLabel)-1 && needBranchAround)
            {
                branchAroundLabel = this->DefineLabel();
                this->Br(Js::OpCode::Br, branchAroundLabel);

                Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == JumpAroundSize);
                currentOffset += JumpAroundSize;

                // Continue to count he jumpAroundSize, because we may have to emit
                // yet another branch island right after if the jumpAroundSize is included.
            }

            // Emit the long branch
            this->MarkLabel(longBranchLabel);
            this->BrLong(Js::OpCode::BrLong, labelID);

            this->inEnsureLongBranch = false;

            Assert(this->m_byteCodeData.GetCurrentOffset() - currentOffset == LongBranchSize);
            currentOffset += LongBranchSize;
            return false;
        });

        if (!foundUnknown)
        {
            // Nothing is found, just set the next branch island from the current offset
            this->UpdateNextBranchIslandOffset(this->m_jumpOffsets->Count(), currentOffset);
        }

        if (branchAroundLabel != (Js::ByteCodeLabel)-1)
        {
            // Make the branch around label if we needed one
            this->MarkLabel(branchAroundLabel);
        }
    }